

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-customdata.cc
# Opt level: O1

void customdata_test(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  double *pdVar5;
  int *piVar6;
  uint uVar7;
  MetaVariable metavar2;
  MetaVariable metavar;
  string retval_str;
  CustomDataType customData;
  MetaVariable stringVal;
  MetaVariable intVal;
  MetaVariable doubleVal;
  storage_union local_1b0;
  undefined1 *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  undefined8 local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  storage_union local_178;
  undefined1 *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined8 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  string local_140;
  string local_120;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  local_100;
  storage_union local_d0;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  storage_union local_98;
  long local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  storage_union local_60;
  long local_50;
  storage_union *local_48;
  storage_union local_38;
  
  local_98.dynamic = (void *)0x4008000000000000;
  tinyusdz::MetaVariable::MetaVariable<double>
            ((MetaVariable *)&local_60,(double *)&local_98.dynamic);
  local_d0._0_4_ = 9;
  tinyusdz::MetaVariable::MetaVariable<int>((MetaVariable *)&local_98,(int *)&local_d0);
  local_178.dynamic = &local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"dora","");
  tinyusdz::MetaVariable::MetaVariable<std::__cxx11::string>
            ((MetaVariable *)&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_178);
  if ((undefined1 **)local_178.dynamic != &local_168) {
    operator_delete(local_178.dynamic,(ulong)(local_168 + 1));
  }
  local_100._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_100._M_impl.super__Rb_tree_header._M_header;
  local_100._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_100._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_100._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_178.dynamic = &local_168;
  local_100._M_impl.super__Rb_tree_header._M_header._M_right =
       local_100._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"hello:myval","");
  bVar3 = tinyusdz::SetCustomDataByKey
                    ((string *)&local_178,(MetaVariable *)&local_60,(CustomDataType *)&local_100);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x1e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", doubleVal, customData)");
  if ((undefined1 **)local_178.dynamic != &local_168) {
    operator_delete(local_178.dynamic,(ulong)(local_168 + 1));
  }
  local_178.dynamic = &local_168;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"hello:myval","");
  bVar3 = tinyusdz::HasCustomDataKey((CustomDataType *)&local_100,(string *)&local_178);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x20,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  if ((undefined1 **)local_178.dynamic != &local_168) {
    operator_delete(local_178.dynamic,(ulong)(local_168 + 1));
  }
  local_168 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_178.dynamic = (void *)0x0;
  local_158 = 0;
  local_150._M_local_buf[0] = '\0';
  local_1b0.dynamic = &local_1a0;
  local_160 = &local_150;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"hello:myval","");
  bVar3 = tinyusdz::GetCustomDataByKey
                    ((CustomDataType *)&local_100,(string *)&local_1b0,(MetaVariable *)&local_178);
  if ((undefined1 **)local_1b0.dynamic != &local_1a0) {
    operator_delete(local_1b0.dynamic,(ulong)(local_1a0 + 1));
  }
  acutest_check_(bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x25,"%s","ret == true");
  uVar7 = 0;
  pdVar5 = tinyusdz::value::Value::as<double>((Value *)&local_178,false);
  if (pdVar5 != (double *)0x0) {
    uVar7 = -(uint)(*pdVar5 == 3.0) & 1;
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2a,"%s","retval == 3.0");
  local_1b0.dynamic = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"hello:myval2","");
  bVar3 = tinyusdz::SetCustomDataByKey
                    ((string *)&local_1b0,(MetaVariable *)&local_d0,(CustomDataType *)&local_100);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2d,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval2\", stringVal, customData)")
  ;
  if ((undefined1 **)local_1b0.dynamic != &local_1a0) {
    operator_delete(local_1b0.dynamic,(ulong)(local_1a0 + 1));
  }
  local_1b0.dynamic = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"hello:myval","");
  bVar3 = tinyusdz::HasCustomDataKey((CustomDataType *)&local_100,(string *)&local_1b0);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x2f,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval\")");
  if ((undefined1 **)local_1b0.dynamic != &local_1a0) {
    operator_delete(local_1b0.dynamic,(ulong)(local_1a0 + 1));
  }
  local_1b0.dynamic = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"hello:myval2","");
  bVar3 = tinyusdz::HasCustomDataKey((CustomDataType *)&local_100,(string *)&local_1b0);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x30,"%s","tinyusdz::HasCustomDataKey(customData, \"hello:myval2\")");
  if ((undefined1 **)local_1b0.dynamic != &local_1a0) {
    operator_delete(local_1b0.dynamic,(ulong)(local_1a0 + 1));
  }
  local_1a0 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_1b0.dynamic = (void *)0x0;
  local_190 = 0;
  local_188._M_local_buf[0] = '\0';
  paVar1 = &local_120.field_2;
  local_198 = &local_188;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"hello:myval2","");
  bVar3 = tinyusdz::GetCustomDataByKey
                    ((CustomDataType *)&local_100,&local_120,(MetaVariable *)&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x35,"%s","ret == true");
  local_120._M_string_length = 0;
  local_120.field_2._M_local_buf[0] = '\0';
  local_120._M_dataplus._M_p = (pointer)paVar1;
  tinyusdz::MetaVariable::get_value<std::__cxx11::string>((MetaVariable *)&local_1b0,&local_120);
  iVar4 = std::__cxx11::string::compare((char *)&local_120);
  acutest_check_((uint)(iVar4 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3a,"%s","retval_str == \"dora\"");
  paVar2 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"hello:myval","");
  bVar3 = tinyusdz::SetCustomDataByKey
                    (&local_140,(MetaVariable *)&local_98,(CustomDataType *)&local_100);
  acutest_check_((uint)bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x3e,"%s","tinyusdz::SetCustomDataByKey(\"hello:myval\", intVal, customData)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  local_140._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"hello:myval","");
  bVar3 = tinyusdz::GetCustomDataByKey
                    ((CustomDataType *)&local_100,&local_140,(MetaVariable *)&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  acutest_check_(bVar3,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x40,"%s","ret == true");
  uVar7 = 0;
  piVar6 = tinyusdz::value::Value::as<int>((Value *)&local_178,false);
  if (piVar6 != (int *)0x0) {
    uVar7 = (uint)(*piVar6 == 9);
  }
  acutest_check_(uVar7,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-customdata.cc"
                 ,0x45,"%s","ival == 9");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p,
                    CONCAT71(local_120.field_2._M_allocated_capacity._1_7_,
                             local_120.field_2._M_local_buf[0]) + 1);
  }
  if (local_198 != &local_188) {
    operator_delete(local_198,
                    CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1);
  }
  if (local_1a0 != (undefined1 *)0x0) {
    (**(code **)(local_1a0 + 0x20))(&local_1b0);
    local_1a0 = (undefined1 *)0x0;
  }
  if (local_160 != &local_150) {
    operator_delete(local_160,
                    CONCAT71(local_150._M_allocated_capacity._1_7_,local_150._M_local_buf[0]) + 1);
  }
  if (local_168 != (undefined1 *)0x0) {
    (**(code **)(local_168 + 0x20))(&local_178);
    local_168 = (undefined1 *)0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
  ::~_Rb_tree(&local_100);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if (local_c0 != 0) {
    (**(code **)(local_c0 + 0x20))(&local_d0);
    local_c0 = 0;
  }
  if (local_80 != &local_70) {
    operator_delete(local_80,local_70._M_allocated_capacity + 1);
  }
  if (local_88 != 0) {
    (**(code **)(local_88 + 0x20))(&local_98);
    local_88 = 0;
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,(long)local_38.dynamic + 1);
  }
  if (local_50 != 0) {
    (**(code **)(local_50 + 0x20))(&local_60);
  }
  return;
}

Assistant:

void customdata_test(void) {

  MetaVariable doubleVal = double(3.0);
  MetaVariable intVal = int(9);
  MetaVariable stringVal = std::string("dora");

  CustomDataType customData;

  //
  // customData = {
  //    dictionary hello = {
  //      double myval = 3.0
  //    }
  // } 

  // Namespace ':' to create nested dictionary data.
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", doubleVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));

  MetaVariable metavar;
  bool ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);

  TEST_CHECK(ret == true);

  double retval{0.0};
  metavar.get_value<double>(&retval);

  TEST_CHECK(retval == 3.0);

  // Add another key
  TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval2", stringVal, customData));

  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval"));
  TEST_CHECK(tinyusdz::HasCustomDataKey(customData, "hello:myval2"));

  MetaVariable metavar2;
  ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval2", &metavar2);

  TEST_CHECK(ret == true);

  std::string retval_str;
  metavar2.get_value<std::string>(&retval_str);

  TEST_CHECK(retval_str == "dora");

  // override
  {
    TEST_CHECK(tinyusdz::SetCustomDataByKey("hello:myval", intVal, customData));
    ret = tinyusdz::GetCustomDataByKey(customData, "hello:myval", &metavar);
    TEST_CHECK(ret == true);

    int ival{0};
    metavar.get_value<int>(&ival);

    TEST_CHECK(ival == 9);
  }
}